

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_string(lua_State *L)

{
  CTState *cts_00;
  TValue *L_00;
  GCstr *pGVar1;
  lua_State *in_RDI;
  size_t len;
  char *p;
  TValue *o;
  CTState *cts;
  CTState *cts_1;
  int in_stack_ffffffffffffff0c;
  lua_State *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int narg;
  lua_State *in_stack_ffffffffffffff20;
  char *local_d8;
  undefined8 in_stack_ffffffffffffff60;
  CTInfo flags;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  CTState *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  CTState *in_stack_ffffffffffffff80;
  
  flags = (CTInfo)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  narg = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  cts_00 = (CTState *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x194);
  cts_00->L = in_RDI;
  L_00 = lj_lib_checkany(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if ((L_00 + 1 < in_RDI->top) && (*(int *)((long)L_00 + 0xc) != -1)) {
    ffi_checkint(in_stack_ffffffffffffff20,narg);
    in_stack_ffffffffffffff7c = 0x12;
    in_stack_ffffffffffffff80 = cts_00;
    lj_cconv_ct_tv(cts_00,(CType *)CONCAT44(0x12,in_stack_ffffffffffffff78),(uint8_t *)cts_00,
                   (TValue *)CONCAT44(0x12,in_stack_ffffffffffffff68),flags);
    in_stack_ffffffffffffff70 = cts_00;
  }
  else {
    lj_cconv_ct_tv(in_stack_ffffffffffffff80,
                   (CType *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (uint8_t *)in_stack_ffffffffffffff70,
                   (TValue *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
    strlen(local_d8);
  }
  in_RDI->top = L_00 + 1;
  pGVar1 = lj_str_new((lua_State *)in_stack_ffffffffffffff80,
                      (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      (size_t)in_stack_ffffffffffffff70);
  (L_00->u32).lo = (uint32_t)pGVar1;
  (L_00->field_2).it = 0xfffffffb;
  if (*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x54) <=
      *(uint *)((ulong)(in_RDI->glref).ptr32 + 0x50)) {
    lj_gc_step((lua_State *)&L_00->field_2);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_string)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  TValue *o = lj_lib_checkany(L, 1);
  const char *p;
  size_t len;
  if (o+1 < L->top && !tvisnil(o+1)) {
    len = (size_t)ffi_checkint(L, 2);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CVOID), (uint8_t *)&p, o,
		   CCF_ARG(1));
  } else {
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CCHAR), (uint8_t *)&p, o,
		   CCF_ARG(1));
    len = strlen(p);
  }
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  setstrV(L, o, lj_str_new(L, p, len));
  lj_gc_check(L);
  return 1;
}